

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O3

int entity9(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  int iVar1;
  code *pcVar2;
  
  if (tok != 0xf) {
    if (tok == 0x1b) {
      iVar1 = 0xd;
      pcVar2 = entity10;
    }
    else {
      iVar1 = -1;
      pcVar2 = error;
    }
    state->handler = pcVar2;
    return iVar1;
  }
  return 0xb;
}

Assistant:

static int PTRCALL
entity9(PROLOG_STATE *state, int tok, const char *ptr, const char *end,
        const ENCODING *enc) {
  UNUSED_P(ptr);
  UNUSED_P(end);
  UNUSED_P(enc);
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_ENTITY_NONE;
  case XML_TOK_LITERAL:
    state->handler = entity10;
    return XML_ROLE_ENTITY_SYSTEM_ID;
  }
  return common(state, tok);
}